

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::doubling::
     updategroup<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator ISA,iterator SA,iterator first,iterator last)

{
  int iVar1;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar2;
  ulong uVar3;
  BitmapArray<long> *pBVar4;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  
  uVar3 = first.pos_;
  pBVar5 = first.array_;
  pBVar4 = ISA.array_;
  do {
    if (last.pos_ <= uVar3) {
      return;
    }
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar3);
    uVar2 = uVar3;
    pVar6 = uVar3;
    if (-1 < extraout_var) {
      do {
        iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar2);
        (*(pBVar4->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar4,CONCAT44(extraout_var_00,iVar1) + ISA.pos_,-SA.pos_ + uVar2);
        uVar2 = uVar2 + 1;
        pVar6 = last.pos_;
        if (last.pos_ <= uVar2) break;
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar2);
        pVar6 = uVar2;
      } while (-1 < extraout_var_01);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar3,uVar3 - pVar6);
      uVar3 = pVar6;
      if (last.pos_ <= pVar6) {
        return;
      }
    }
    do {
      uVar2 = uVar3;
      iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar2);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar2,~CONCAT44(extraout_var_02,iVar1));
      uVar3 = uVar2 + 1;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar3);
    } while (extraout_var_03 < 0);
    do {
      iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar6);
      (*(pBVar4->super_Bitmap)._vptr_Bitmap[4])
                (pBVar4,CONCAT44(extraout_var_04,iVar1) + ISA.pos_,-SA.pos_ + uVar3);
      pVar6 = pVar6 + 1;
    } while (pVar6 <= uVar3);
    uVar3 = uVar2 + 2;
  } while( true );
}

Assistant:

void updategroup(ISAIterator_type ISA, const SAIterator_type SA,
                 SAIterator_type first, SAIterator_type last) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  SAIterator_type a, b;
  value_type t;

  for (a = first; a < last; ++a) {
    if (0 <= *a) {
      b = a;
      do {
        ISA[*a] = a - SA;
      } while ((++a < last) && (0 <= *a));
      *b = b - a;
      if (last <= a) {
        break;
      }
    }
    b = a;
    do {
      *a = ~*a;
    } while (*++a < 0);
    t = a - SA;
    do {
      ISA[*b] = t;
    } while (++b <= a);
  }
}